

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtran.c
# Opt level: O0

void usage(void)

{
  fprintf(_stderr,"usage: %s [switches] ",progname);
  fprintf(_stderr,"[inputfile]\n");
  fprintf(_stderr,"Switches (names may be abbreviated):\n");
  fprintf(_stderr,"  -copy none     Copy no extra markers from source file\n");
  fprintf(_stderr,"  -copy comments Copy only comment markers (default)\n");
  fprintf(_stderr,"  -copy icc      Copy only ICC profile markers\n");
  fprintf(_stderr,"  -copy all      Copy all extra markers\n");
  fprintf(_stderr,"  -optimize      Optimize Huffman table (smaller file, but slow compression)\n");
  fprintf(_stderr,"  -progressive   Create progressive JPEG file\n");
  fprintf(_stderr,"Switches for modifying the image:\n");
  fprintf(_stderr,"  -crop WxH+X+Y  Crop to a rectangular region\n");
  fprintf(_stderr,"  -drop +X+Y filename          Drop (insert) another image\n");
  fprintf(_stderr,"  -flip [horizontal|vertical]  Mirror image (left-right or top-bottom)\n");
  fprintf(_stderr,"  -grayscale     Reduce to grayscale (omit color data)\n");
  fprintf(_stderr,"  -perfect       Fail if there is non-transformable edge blocks\n");
  fprintf(_stderr,"  -rotate [90|180|270]         Rotate image (degrees clockwise)\n");
  fprintf(_stderr,"  -transpose     Transpose image\n");
  fprintf(_stderr,"  -transverse    Transverse transpose image\n");
  fprintf(_stderr,"  -trim          Drop non-transformable edge blocks\n");
  fprintf(_stderr,"                 with -drop: Requantize drop file to match source file\n");
  fprintf(_stderr,"  -wipe WxH+X+Y  Wipe (gray out) a rectangular region\n");
  fprintf(_stderr,"Switches for advanced users:\n");
  fprintf(_stderr,"  -arithmetic    Use arithmetic coding\n");
  fprintf(_stderr,"  -icc FILE      Embed ICC profile contained in FILE\n");
  fprintf(_stderr,"  -restart N     Set restart interval in rows, or in blocks with B\n");
  fprintf(_stderr,"  -maxmemory N   Maximum memory to use (in kbytes)\n");
  fprintf(_stderr,"  -maxscans N    Maximum number of scans to allow in input file\n");
  fprintf(_stderr,"  -outfile name  Specify name for output file\n");
  fprintf(_stderr,"  -report        Report transformation progress\n");
  fprintf(_stderr,"  -strict        Treat all warnings as fatal\n");
  fprintf(_stderr,"  -verbose  or  -debug   Emit debug output\n");
  fprintf(_stderr,"  -version       Print version information and exit\n");
  fprintf(_stderr,"Switches for wizards:\n");
  fprintf(_stderr,"  -scans FILE    Create multi-scan JPEG per script FILE\n");
  exit(1);
}

Assistant:

LOCAL(void)
usage(void)
/* complain about bad command line */
{
  fprintf(stderr, "usage: %s [switches] ", progname);
#ifdef TWO_FILE_COMMANDLINE
  fprintf(stderr, "inputfile outputfile\n");
#else
  fprintf(stderr, "[inputfile]\n");
#endif

  fprintf(stderr, "Switches (names may be abbreviated):\n");
  fprintf(stderr, "  -copy none     Copy no extra markers from source file\n");
  fprintf(stderr, "  -copy comments Copy only comment markers (default)\n");
  fprintf(stderr, "  -copy icc      Copy only ICC profile markers\n");
  fprintf(stderr, "  -copy all      Copy all extra markers\n");
#ifdef ENTROPY_OPT_SUPPORTED
  fprintf(stderr, "  -optimize      Optimize Huffman table (smaller file, but slow compression)\n");
#endif
#ifdef C_PROGRESSIVE_SUPPORTED
  fprintf(stderr, "  -progressive   Create progressive JPEG file\n");
#endif
  fprintf(stderr, "Switches for modifying the image:\n");
#if TRANSFORMS_SUPPORTED
  fprintf(stderr, "  -crop WxH+X+Y  Crop to a rectangular region\n");
  fprintf(stderr, "  -drop +X+Y filename          Drop (insert) another image\n");
  fprintf(stderr, "  -flip [horizontal|vertical]  Mirror image (left-right or top-bottom)\n");
  fprintf(stderr, "  -grayscale     Reduce to grayscale (omit color data)\n");
  fprintf(stderr, "  -perfect       Fail if there is non-transformable edge blocks\n");
  fprintf(stderr, "  -rotate [90|180|270]         Rotate image (degrees clockwise)\n");
#endif
#if TRANSFORMS_SUPPORTED
  fprintf(stderr, "  -transpose     Transpose image\n");
  fprintf(stderr, "  -transverse    Transverse transpose image\n");
  fprintf(stderr, "  -trim          Drop non-transformable edge blocks\n");
  fprintf(stderr, "                 with -drop: Requantize drop file to match source file\n");
  fprintf(stderr, "  -wipe WxH+X+Y  Wipe (gray out) a rectangular region\n");
#endif
  fprintf(stderr, "Switches for advanced users:\n");
#ifdef C_ARITH_CODING_SUPPORTED
  fprintf(stderr, "  -arithmetic    Use arithmetic coding\n");
#endif
  fprintf(stderr, "  -icc FILE      Embed ICC profile contained in FILE\n");
  fprintf(stderr, "  -restart N     Set restart interval in rows, or in blocks with B\n");
  fprintf(stderr, "  -maxmemory N   Maximum memory to use (in kbytes)\n");
  fprintf(stderr, "  -maxscans N    Maximum number of scans to allow in input file\n");
  fprintf(stderr, "  -outfile name  Specify name for output file\n");
  fprintf(stderr, "  -report        Report transformation progress\n");
  fprintf(stderr, "  -strict        Treat all warnings as fatal\n");
  fprintf(stderr, "  -verbose  or  -debug   Emit debug output\n");
  fprintf(stderr, "  -version       Print version information and exit\n");
  fprintf(stderr, "Switches for wizards:\n");
#ifdef C_MULTISCAN_FILES_SUPPORTED
  fprintf(stderr, "  -scans FILE    Create multi-scan JPEG per script FILE\n");
#endif
  exit(EXIT_FAILURE);
}